

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Noise.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Noise::ArchiveOUT(ChFunction_Noise *this,ChArchiveOut *marchive)

{
  ChNameValue<int> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChFunction_Noise>(marchive);
  ChFunction::ArchiveOUT(&this->super_ChFunction,marchive);
  local_30._value = &this->amp;
  local_30._name = "amp";
  local_30._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_30);
  local_48._value = &this->freq;
  local_48._name = "freq";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_48);
  local_60._value = &this->amp_ratio;
  local_60._name = "amp_ratio";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_60);
  local_78._value = &this->octaves;
  local_78._name = "octaves";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_78);
  return;
}

Assistant:

void ChFunction_Noise::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunction_Noise>();
    // serialize parent class
    ChFunction::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(amp);
    marchive << CHNVP(freq);
    marchive << CHNVP(amp_ratio);
    marchive << CHNVP(octaves);
}